

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Diag(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  long lVar1;
  long lVar2;
  Fad<double> *v;
  Fad<double> *pFVar3;
  long lVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RSI;
  Fad<double> *in_RDI;
  int64_t c;
  Fad<double> pivot;
  int64_t r;
  char *in_stack_00000118;
  char *in_stack_00000120;
  TPZBaseMatrix *in_stack_ffffffffffffff20;
  undefined1 local_a0 [8];
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  undefined1 local_70 [48];
  long local_40;
  undefined1 local_38 [32];
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  v = (Fad<double> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar3 = (Fad<double> *)(**(code **)((long)in_RDI->val_ + 0x60))();
  if (v != pFVar3) {
    Error(in_stack_00000120,in_stack_00000118);
  }
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    lVar4 = (**(code **)((long)in_RDI->val_ + 0x60))();
    if (lVar4 <= lVar1) break;
    (**(code **)((long)in_RDI->val_ + 0x120))(local_38,in_RDI,local_18,local_18);
    local_40 = 0;
    while( true ) {
      lVar1 = local_40;
      iVar5 = TPZBaseMatrix::Cols(local_10);
      lVar2 = local_18;
      lVar4 = local_40;
      if (iVar5 <= lVar1) break;
      in_stack_ffffffffffffff20 = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_a0);
      operator/<Fad<double>,_Fad<double>,_nullptr>(v,in_RDI);
      Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      (*(in_stack_ffffffffffffff20->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_stack_ffffffffffffff20,lVar2,lVar4,local_70);
      Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffff20);
      FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff20);
      Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffff20);
      local_40 = local_40 + 1;
    }
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffff20);
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}